

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O3

void __thiscall
duckdb::UncompressedStringStorage::WriteStringMemory
          (UncompressedStringStorage *this,ColumnSegment *segment,string_t string,
          block_id_t *result_block,int32_t *result_offset)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  BlockManager *pBVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> _Var3;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> __ptr_00;
  StringBlock *__ptr_01;
  data_ptr_t pdVar4;
  uint uVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  BufferManager *pBVar8;
  pointer pSVar9;
  idx_t iVar10;
  idx_t iVar11;
  BlockHandle *pBVar12;
  void *pvVar13;
  pointer *__ptr;
  ulong uVar14;
  BufferHandle handle;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> local_a8;
  ulong local_a0;
  shared_ptr<duckdb::BlockHandle,_true> local_98;
  BufferHandle local_88;
  BufferHandle local_70;
  void *local_58;
  block_id_t *local_50;
  block_id_t *local_48;
  undefined8 local_40;
  void *local_38;
  
  local_48 = string.value._8_8_;
  pvVar13 = string.value._0_8_;
  local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = segment;
  local_38 = pvVar13;
  BufferHandle::BufferHandle(&local_70);
  pBVar8 = BufferManager::GetBufferManager(*(DatabaseInstance **)(this + 0x20));
  local_88.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)(this + 0xd8);
  local_50 = result_block;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_88);
  peVar6 = local_88.handle.internal.
           super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar5 = (uint)segment;
  this_00 = &((local_88.handle.internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
             super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_a0 = (ulong)(uVar5 + 4);
  local_58 = pvVar13;
  if (((local_88.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
      super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
             operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                         *)this_00);
    iVar10 = pSVar9->offset;
    pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
             operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                         *)this_00);
    if (iVar10 + local_a0 < pSVar9->size) {
      pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
               operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                           *)this_00);
      (*pBVar8->_vptr_BufferManager[7])(&local_88,pBVar8,pSVar9);
      BufferHandle::operator=(&local_70,&local_88);
      BufferHandle::~BufferHandle(&local_88);
      goto LAB_016f3c8f;
    }
  }
  pBVar12 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                      ((shared_ptr<duckdb::BlockHandle,_true> *)(this + 0xa8));
  pBVar1 = pBVar12->block_manager;
  iVar10 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar11 = optional_idx::GetIndex(&pBVar1->block_header_size);
  uVar14 = iVar10 - iVar11;
  if (iVar10 - iVar11 < local_a0) {
    uVar14 = local_a0;
  }
  local_a8._M_head_impl = (StringBlock *)operator_new(0x28);
  (local_a8._M_head_impl)->offset = 0;
  (local_a8._M_head_impl)->size = 0;
  ((local_a8._M_head_impl)->block).internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_a8._M_head_impl)->block).internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_a8._M_head_impl)->next).
  super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
  super__Head_base<0UL,_duckdb::StringBlock_*,_false> =
       (_Head_base<0UL,_duckdb::StringBlock_*,_false>)0x0;
  pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)&local_a8);
  pSVar9->offset = 0;
  pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)&local_a8);
  pSVar9->size = uVar14;
  (*pBVar8->_vptr_BufferManager[4])(&local_88,pBVar8,8,uVar14,0);
  BufferHandle::operator=(&local_70,&local_88);
  BufferHandle::~BufferHandle(&local_88);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&local_98,&local_70.handle);
  pBVar12 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&local_98);
  peVar2 = (element_type *)pBVar12->block_id;
  local_88.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::operator*
                 ((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true> *
                  )&local_a8);
  local_88.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  ::std::
  _Hashtable<long,std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>,std::allocator<std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<long,duckdb::StringBlock&>>
            ((_Hashtable<long,std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>,std::allocator<std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&peVar6->block_manager);
  pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)&local_a8);
  _Var7._M_pi = local_98.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar6 = local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (pSVar9->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pSVar9->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar6;
  (pSVar9->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)&local_a8);
  _Var3._M_head_impl = (StringBlock *)this_00->_M_pi;
  this_00->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __ptr_00._M_head_impl =
       (pSVar9->next).
       super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
       super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
       super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl;
  (pSVar9->next).super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>.
  _M_t.super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
  super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (__ptr_00._M_head_impl != (StringBlock *)0x0) {
    ::std::default_delete<duckdb::StringBlock>::operator()
              ((default_delete<duckdb::StringBlock> *)&pSVar9->next,__ptr_00._M_head_impl);
  }
  _Var3._M_head_impl = local_a8._M_head_impl;
  local_a8._M_head_impl = (StringBlock *)0x0;
  __ptr_01 = (StringBlock *)this_00->_M_pi;
  this_00->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3._M_head_impl;
  if (__ptr_01 != (StringBlock *)0x0) {
    ::std::default_delete<duckdb::StringBlock>::operator()
              ((default_delete<duckdb::StringBlock> *)this_00,__ptr_01);
    if (local_a8._M_head_impl != (StringBlock *)0x0) {
      ::std::default_delete<duckdb::StringBlock>::operator()
                ((default_delete<duckdb::StringBlock> *)&local_a8,local_a8._M_head_impl);
    }
  }
LAB_016f3c8f:
  pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)this_00);
  pBVar12 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pSVar9->block);
  *local_48 = pBVar12->block_id;
  pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)this_00);
  *(int *)local_50 = (int)pSVar9->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_70.node);
  pdVar4 = (local_70.node.ptr)->buffer;
  pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)this_00);
  iVar10 = pSVar9->offset;
  *(uint *)(pdVar4 + iVar10) = uVar5;
  pvVar13 = local_58;
  if (uVar5 < 0xd) {
    pvVar13 = (void *)((long)&local_40 + 4);
  }
  switchD_012b9b0d::default
            ((uint *)((long)(pdVar4 + iVar10) + 4),pvVar13,(ulong)segment & 0xffffffff);
  pSVar9 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)this_00);
  pSVar9->offset = pSVar9->offset + local_a0;
  BufferHandle::~BufferHandle(&local_70);
  if (local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void UncompressedStringStorage::WriteStringMemory(ColumnSegment &segment, string_t string, block_id_t &result_block,
                                                  int32_t &result_offset) {
	auto total_length = UnsafeNumericCast<uint32_t>(string.GetSize() + sizeof(uint32_t));
	shared_ptr<BlockHandle> block;
	BufferHandle handle;

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();
	// check if the string fits in the current block
	if (!state.head || state.head->offset + total_length >= state.head->size) {
		// string does not fit, allocate space for it
		// create a new string block
		auto alloc_size = MaxValue<idx_t>(total_length, segment.GetBlockManager().GetBlockSize());
		auto new_block = make_uniq<StringBlock>();
		new_block->offset = 0;
		new_block->size = alloc_size;
		// allocate an in-memory buffer for it
		handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, alloc_size, false);
		block = handle.GetBlockHandle();
		state.overflow_blocks.insert(make_pair(block->BlockId(), reference<StringBlock>(*new_block)));
		new_block->block = std::move(block);
		new_block->next = std::move(state.head);
		state.head = std::move(new_block);
	} else {
		// string fits, copy it into the current block
		handle = buffer_manager.Pin(state.head->block);
	}

	result_block = state.head->block->BlockId();
	result_offset = UnsafeNumericCast<int32_t>(state.head->offset);

	// copy the string and the length there
	auto ptr = handle.Ptr() + state.head->offset;
	Store<uint32_t>(UnsafeNumericCast<uint32_t>(string.GetSize()), ptr);
	ptr += sizeof(uint32_t);
	memcpy(ptr, string.GetData(), string.GetSize());
	state.head->offset += total_length;
}